

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeGenerator.cpp
# Opt level: O2

void __thiscall
Wasm::WasmBytecodeGenerator::EnterEvalStackScope(WasmBytecodeGenerator *this,BlockInfo *blockInfo)

{
  uint32 i;
  uint index;
  EmitInfo local_30;
  
  local_30.super_EmitInfoBase.location = 0xffffffff;
  local_30.type = Limit;
  JsUtil::List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
  ::Add(&(this->m_evalStack).list,&local_30);
  for (index = 0; index < (blockInfo->paramInfo).count; index = index + 1) {
    local_30 = PolymorphicEmitInfo::GetInfo(&blockInfo->paramInfo,index);
    JsUtil::
    List<Wasm::EmitInfo,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (&(this->m_evalStack).list,&local_30);
  }
  return;
}

Assistant:

void WasmBytecodeGenerator::EnterEvalStackScope(const BlockInfo* blockInfo)
{
    m_evalStack.Push(EmitInfo(WasmTypes::Limit));
    // Push the in-params of the block upon entering the scope
    for (uint32 i = 0; i < blockInfo->paramInfo.Count(); ++i)
    {
        m_evalStack.Push(blockInfo->paramInfo.GetInfo(i));
    }
}